

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::onEnterIdentifierExpressionAstNode
          (SemanticAnalyzerRun *this,IdentifierExpressionAstNode *node)

{
  string local_48;
  allocator<char> local_21;
  
  Scope::find((optional<VariableDefinition> *)&local_48,
              (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              &((node->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value,
              true);
  std::_Optional_payload_base<VariableDefinition>::_M_reset
            ((_Optional_payload_base<VariableDefinition> *)&local_48);
  if (local_48.field_2._M_local_buf[8] == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Undefined reference in identifier evaluation.",&local_21);
    reportError(this,&node->token,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void onEnterIdentifierExpressionAstNode(IdentifierExpressionAstNode* node) noexcept override {
    if (!this->currentScope->find(node->token->value, true)) {
      this->reportError(node->token, "Undefined reference in identifier evaluation.");
    }
  }